

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.cc
# Opt level: O3

void CoreML::Specification::protobuf_NearestNeighbors_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_0041b208 == '\x01') {
    DAT_0041b208 = '\0';
    (*(code *)*_KNearestNeighborsClassifier_default_instance_)();
  }
  if (DAT_0041b290 == '\x01') {
    DAT_0041b290 = '\0';
    (*(code *)*_NearestNeighborsIndex_default_instance_)();
  }
  if (DAT_0041b2c8 == '\x01') {
    DAT_0041b2c8 = '\0';
    (*(code *)*_UniformWeighting_default_instance_)();
  }
  if (DAT_0041b2e8 == '\x01') {
    DAT_0041b2e8 = '\0';
    (*(code *)*_InverseDistanceWeighting_default_instance_)();
  }
  if (DAT_0041b308 == '\x01') {
    DAT_0041b308 = '\0';
    (*(code *)*_LinearIndex_default_instance_)();
  }
  if (DAT_0041b328 == '\x01') {
    DAT_0041b328 = '\0';
    (*(code *)*_SingleKdTreeIndex_default_instance_)();
  }
  if (DAT_0041b348 == '\x01') {
    DAT_0041b348 = 0;
    (*(code *)*_SquaredEuclideanDistance_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _KNearestNeighborsClassifier_default_instance_.Shutdown();
  _NearestNeighborsIndex_default_instance_.Shutdown();
  _UniformWeighting_default_instance_.Shutdown();
  _InverseDistanceWeighting_default_instance_.Shutdown();
  _LinearIndex_default_instance_.Shutdown();
  _SingleKdTreeIndex_default_instance_.Shutdown();
  _SquaredEuclideanDistance_default_instance_.Shutdown();
}